

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

TypeID NULLCTypeInfo::TypeReturnType(int *typeID)

{
  ExternTypeInfo *pEVar1;
  ExternMemberInfo *pEVar2;
  char *pcVar3;
  uint uVar4;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),*typeID);
    if (pEVar1->subCat == CAT_FUNCTION) {
      pEVar2 = FastVector<ExternMemberInfo,_false,_false>::operator[]
                         ((FastVector<ExternMemberInfo,_false,_false> *)(linker + 0x210),0);
      uVar4 = pEVar2[(pEVar1->field_11).subType].type;
    }
    else {
      pcVar3 = FastVector<char,_false,_false>::operator[]
                         ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
      uVar4 = 0;
      nullcThrowError("typeid::returnType received type (%s) that is not a function",pcVar3);
    }
    return (TypeID)uVar4;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0xdf,"TypeID NULLCTypeInfo::TypeReturnType(int *)");
}

Assistant:

TypeID TypeReturnType(int* typeID)
	{
		assert(linker);
		ExternTypeInfo &type = linker->exTypes[*typeID];
		if(type.subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("typeid::returnType received type (%s) that is not a function", &linker->exSymbols[type.offsetToName]);
			return getTypeID(0);
		}
		ExternMemberInfo *memberList = &linker->exTypeExtra[0];
		return getTypeID(memberList[type.memberOffset].type);
	}